

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

void __thiscall bsplib::Unbuf::~Unbuf(Unbuf *this)

{
  Unbuf *this_local;
  
  MPI_Comm_free(&this->m_comm);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_ready);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~vector(&this->m_reqs);
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::~vector(&this->m_recvs);
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::~vector(&this->m_sends);
  return;
}

Assistant:

Unbuf::~Unbuf() {
    MPI_Comm_free( &m_comm );
    m_comm = MPI_COMM_NULL;
}